

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_common.h
# Opt level: O0

void __thiscall
iffl::buffer_t<char_const>::buffer_t<char,std::enable_if<false,void>>
          (buffer_t<char_const> *this,buffer_t<char> *buff)

{
  buffer_t<char> *buff_local;
  buffer_t<const_char> *this_local;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(pointer_type *)this = buff->begin;
  *(pointer_type *)(this + 8) = buff->last;
  *(pointer_type *)(this + 0x10) = buff->end;
  return;
}

Assistant:

buffer_t(buffer_t<V> const &buff) {
            begin = buff.begin;
            last = buff.last;
            end = buff.end;
        }